

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O0

OPTIONHANDLER_HANDLE message_queue_retrieve_options(MESSAGE_QUEUE_HANDLE message_queue)

{
  OPTIONHANDLER_RESULT OVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  MESSAGE_QUEUE_HANDLE message_queue_local;
  
  if (message_queue == (MESSAGE_QUEUE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"message_queue_retrieve_options",0x2b3,1,"invalid argument (message_queue is NULL)"
               );
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)OptionHandler_Create(cloneOption,destroyOption,setOption);
    if ((OPTIONHANDLER_HANDLE)l == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                  ,"message_queue_retrieve_options",0x2b8,1,"failed creating OPTIONHANDLER_HANDLE");
      }
    }
    else {
      OVar1 = OptionHandler_AddOption
                        ((OPTIONHANDLER_HANDLE)l,SAVED_OPTION_MAX_ENQUEUE_TIME_SECS,
                         &message_queue->max_message_enqueued_time_secs);
      if (OVar1 == OPTIONHANDLER_OK) {
        OVar1 = OptionHandler_AddOption
                          ((OPTIONHANDLER_HANDLE)l,SAVED_OPTION_MAX_PROCESSING_TIME_SECS,
                           &message_queue->max_message_processing_time_secs);
        if (OVar1 == OPTIONHANDLER_OK) {
          OVar1 = OptionHandler_AddOption
                            ((OPTIONHANDLER_HANDLE)l,SAVED_OPTION_MAX_RETRY_COUNT,
                             &message_queue->max_retry_count);
          if (OVar1 != OPTIONHANDLER_OK) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                        ,"message_queue_retrieve_options",0x2c8,1,
                        "failed retrieving options (failed adding %s)",
                        SAVED_OPTION_MAX_PROCESSING_TIME_SECS);
            }
            OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                      ,"message_queue_retrieve_options",0x2c2,1,
                      "failed retrieving options (failed adding %s)",
                      SAVED_OPTION_MAX_PROCESSING_TIME_SECS);
          }
          OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                    ,"message_queue_retrieve_options",700,1,
                    "failed retrieving options (failed adding %s)",
                    SAVED_OPTION_MAX_ENQUEUE_TIME_SECS);
        }
        OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

OPTIONHANDLER_HANDLE message_queue_retrieve_options(MESSAGE_QUEUE_HANDLE message_queue)
{
    OPTIONHANDLER_HANDLE result;

    if (message_queue == NULL)
    {
        LogError("invalid argument (message_queue is NULL)");
        result = NULL;
    }
    else if ((result = OptionHandler_Create(cloneOption, destroyOption, setOption)) == NULL)
    {
        LogError("failed creating OPTIONHANDLER_HANDLE");
    }
    else if (OptionHandler_AddOption(result, SAVED_OPTION_MAX_ENQUEUE_TIME_SECS, &message_queue->max_message_enqueued_time_secs) != OPTIONHANDLER_OK)
    {
        LogError("failed retrieving options (failed adding %s)", SAVED_OPTION_MAX_ENQUEUE_TIME_SECS);
        OptionHandler_Destroy(result);
        result = NULL;
    }
    else if (OptionHandler_AddOption(result, SAVED_OPTION_MAX_PROCESSING_TIME_SECS, &message_queue->max_message_processing_time_secs) != OPTIONHANDLER_OK)
    {
        LogError("failed retrieving options (failed adding %s)", SAVED_OPTION_MAX_PROCESSING_TIME_SECS);
        OptionHandler_Destroy(result);
        result = NULL;
    }
    else if (OptionHandler_AddOption(result, SAVED_OPTION_MAX_RETRY_COUNT, &message_queue->max_retry_count) != OPTIONHANDLER_OK)
    {
        LogError("failed retrieving options (failed adding %s)", SAVED_OPTION_MAX_PROCESSING_TIME_SECS);
        OptionHandler_Destroy(result);
        result = NULL;
    }

    return result;
}